

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet6_address.cpp
# Opt level: O0

void __thiscall
sockpp::inet6_address::inet6_address(inet6_address *this,in6_addr *addr,in_port_t port)

{
  uint16_t uVar1;
  in_port_t port_local;
  in6_addr *addr_local;
  inet6_address *this_local;
  
  sock_address::sock_address(&this->super_sock_address);
  (this->super_sock_address)._vptr_sock_address = (_func_int **)&PTR__inet6_address_00119b28;
  (this->addr_).sin6_family = 0;
  (this->addr_).sin6_port = 0;
  (this->addr_).sin6_flowinfo = 0;
  memset(&(this->addr_).sin6_addr,0,0x10);
  (this->addr_).sin6_scope_id = 0;
  (this->addr_).sin6_family = 10;
  *(undefined8 *)&(this->addr_).sin6_addr.__in6_u = *(undefined8 *)&addr->__in6_u;
  *(undefined8 *)((long)&(this->addr_).sin6_addr.__in6_u + 8) =
       *(undefined8 *)((long)&addr->__in6_u + 8);
  uVar1 = htons(port);
  (this->addr_).sin6_port = uVar1;
  return;
}

Assistant:

inet6_address::inet6_address(const in6_addr& addr, in_port_t port) {
    addr_.sin6_family = AF_INET6;
    addr_.sin6_addr = addr;
    addr_.sin6_port = htons(port);
#if defined(__APPLE__) || defined(BSD)
    addr_.sin6_len = (uint8_t)SZ;
#endif
}